

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::state::encode
          (state *this,symbol_codec *codec,CLZBase *lzbase,search_accelerator *dict,
          lzdecision *lzdec)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  undefined1 *puVar11;
  bool bVar12;
  quasi_adaptive_huffman_data_model *pqVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  cVar8 = (char)this;
  uVar16 = (uint)codec;
  cVar7 = lzham::symbol_codec::encode
                    (uVar16,(adaptive_bit_model *)(ulong)(0 < lzdec->m_len),
                     (bool)(cVar8 + (char)(this->super_state_base).m_cur_state * '\x02' + '$'));
  if (cVar7 == '\0') {
    return false;
  }
  if (lzdec->m_len < 1) {
    puVar4 = (dict->m_dict).m_p;
    bVar14 = puVar4[(uint)lzdec->m_pos];
    if (6 < (this->super_state_base).m_cur_state) {
      bVar14 = bVar14 ^ puVar4[lzdec->m_pos - (this->super_state_base).m_match_hist[0] &
                               dict->m_max_dict_size_mask];
    }
    cVar8 = lzham::symbol_codec::encode(uVar16,(quasi_adaptive_huffman_data_model *)(ulong)bVar14);
    if (cVar8 == '\0') {
      return false;
    }
    uVar16 = (this->super_state_base).m_cur_state;
    uVar9 = 0;
    if (3 < uVar16) {
      if (uVar16 < 10) {
        uVar9 = uVar16 - 3;
      }
      else {
        uVar9 = uVar16 - 6;
      }
    }
    goto LAB_0010c8e2;
  }
  bVar12 = (bool)(cVar8 + '<' + (char)(this->super_state_base).m_cur_state * '\x02');
  if (lzdec->m_dist < 0) {
    cVar7 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x1,bVar12);
    if (cVar7 == '\0') {
      return false;
    }
    iVar3 = lzdec->m_dist;
    bVar12 = (bool)(cVar8 + (char)(this->super_state_base).m_cur_state * '\x02' + 'T');
    if (iVar3 == -1) {
      cVar7 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x1,bVar12);
      if (cVar7 == '\0') {
        return false;
      }
      bVar12 = (bool)(cVar8 + 'l' + (char)(this->super_state_base).m_cur_state * '\x02');
      if (lzdec->m_len == 1) {
        cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x1,bVar12);
        if (cVar8 == '\0') {
          return false;
        }
        uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 2 + 9;
        goto LAB_0010c8e2;
      }
      cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x0,bVar12);
      if (cVar8 == '\0') {
        return false;
      }
      if (lzdec->m_len < 0x102) {
        cVar8 = lzham::symbol_codec::encode
                          (uVar16,(quasi_adaptive_huffman_data_model *)(ulong)(lzdec->m_len - 2));
      }
      else {
        cVar8 = lzham::symbol_codec::encode(uVar16,(quasi_adaptive_huffman_data_model *)0x100);
        if (cVar8 == '\0') {
          return false;
        }
        iVar3 = lzdec->m_len;
        uVar17 = iVar3 - 0x102;
        uVar18 = uVar17;
        if (0xff < uVar17) {
          if (uVar17 < 0x500) {
            uVar18 = iVar3 - 0x202U | 0x800;
          }
          else {
            uVar18 = iVar3 - 0x1602U | 0x70000;
            if (uVar17 < 0x1500) {
              uVar18 = iVar3 - 0x602U | 0x6000;
            }
          }
        }
        cVar8 = lzham::symbol_codec::encode_bits(uVar16,uVar18);
      }
      if (cVar8 == '\0') {
        return false;
      }
    }
    else {
      cVar7 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x0,bVar12);
      if (cVar7 == '\0') {
        return false;
      }
      if (lzdec->m_len < 0x102) {
        cVar7 = lzham::symbol_codec::encode
                          (uVar16,(quasi_adaptive_huffman_data_model *)(ulong)(lzdec->m_len - 2));
      }
      else {
        cVar7 = lzham::symbol_codec::encode(uVar16,(quasi_adaptive_huffman_data_model *)0x100);
        if (cVar7 == '\0') {
          return false;
        }
        iVar2 = lzdec->m_len;
        uVar17 = iVar2 - 0x102;
        uVar18 = uVar17;
        if (0xff < uVar17) {
          if (uVar17 < 0x500) {
            uVar18 = iVar2 - 0x202U | 0x800;
          }
          else {
            uVar18 = iVar2 - 0x1602U | 0x70000;
            if (uVar17 < 0x1500) {
              uVar18 = iVar2 - 0x602U | 0x6000;
            }
          }
        }
        cVar7 = lzham::symbol_codec::encode_bits(uVar16,uVar18);
      }
      if (cVar7 == '\0') {
        return false;
      }
      bVar12 = (bool)(cVar8 + (char)(this->super_state_base).m_cur_state * '\x02' + -0x7c);
      if (iVar3 == -2) {
        cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x1,bVar12);
        if (cVar8 == '\0') {
          return false;
        }
        uVar1 = *(undefined8 *)(this->super_state_base).m_match_hist;
        *(ulong *)(this->super_state_base).m_match_hist =
             CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
      }
      else {
        cVar7 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x0,bVar12);
        if (cVar7 == '\0') {
          return false;
        }
        bVar12 = (bool)(cVar8 + (char)(this->super_state_base).m_cur_state * '\x02' + -100);
        if (iVar3 == -3) {
          cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x1,bVar12);
          if (cVar8 == '\0') {
            return false;
          }
          uVar9 = (this->super_state_base).m_match_hist[2];
          *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
               *(undefined8 *)(this->super_state_base).m_match_hist;
          (this->super_state_base).m_match_hist[0] = uVar9;
        }
        else {
          cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x0,bVar12);
          if (cVar8 == '\0') {
            return false;
          }
          uVar9 = (this->super_state_base).m_match_hist[0];
          uVar5 = (this->super_state_base).m_match_hist[1];
          uVar6 = (this->super_state_base).m_match_hist[2];
          (this->super_state_base).m_match_hist[0] = (this->super_state_base).m_match_hist[3];
          (this->super_state_base).m_match_hist[1] = uVar9;
          (this->super_state_base).m_match_hist[2] = uVar5;
          (this->super_state_base).m_match_hist[3] = uVar6;
        }
      }
    }
    uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 8;
    goto LAB_0010c8e2;
  }
  cVar8 = lzham::symbol_codec::encode(uVar16,(adaptive_bit_model *)0x0,bVar12);
  if (cVar8 == '\0') {
    return false;
  }
  uVar17 = lzdec->m_dist;
  if ((ulong)uVar17 < 0x1000) {
    uVar18 = (uint)(byte)CLZBase::m_slot_tab0[uVar17];
  }
  else {
    if (uVar17 < 0x100000) {
      uVar18 = uVar17 >> 0xb;
      puVar11 = CLZBase::m_slot_tab1;
    }
    else {
      if (0xffffff < uVar17) {
        if (uVar17 < 0x2000000) {
          uVar18 = (uVar17 - 0x1000000 >> 0x17) + 0x30;
        }
        else if (uVar17 < 0x4000000) {
          uVar18 = (uVar17 + 0xfe000000 >> 0x18) + 0x32;
        }
        else {
          uVar18 = (uVar17 + 0xfc000000 >> 0x19) + 0x34;
        }
        goto LAB_0010c440;
      }
      uVar18 = uVar17 >> 0x10;
      puVar11 = CLZBase::m_slot_tab2;
    }
    uVar18 = (uint)(byte)puVar11[uVar18];
  }
LAB_0010c440:
  uVar17 = uVar17 - *(int *)((long)&CLZDecompBase::m_lzx_position_base + (ulong)(uVar18 * 4)) &
           *(uint *)((long)&CLZDecompBase::m_lzx_position_extra_mask + (ulong)(uVar18 * 4));
  iVar3 = lzdec->m_len;
  pqVar13 = (quasi_adaptive_huffman_data_model *)0xffffffff;
  if (8 < iVar3) {
    pqVar13 = (quasi_adaptive_huffman_data_model *)(ulong)(iVar3 - 9);
  }
  uVar10 = 7;
  if (iVar3 < 9) {
    uVar10 = iVar3 - 2;
  }
  cVar8 = lzham::symbol_codec::encode
                    (uVar16,(quasi_adaptive_huffman_data_model *)
                            (ulong)((uVar18 * 8 - 8 | uVar10) + 2));
  if (cVar8 != '\0') {
    if (-1 < (int)pqVar13) {
      if (lzdec->m_len < 0x102) {
        cVar8 = lzham::symbol_codec::encode(uVar16,pqVar13);
      }
      else {
        cVar8 = lzham::symbol_codec::encode(uVar16,(quasi_adaptive_huffman_data_model *)0xf9);
        if (cVar8 == '\0') {
          return false;
        }
        iVar3 = lzdec->m_len;
        uVar10 = iVar3 - 0x102;
        uVar15 = uVar10;
        if (0xff < uVar10) {
          if (uVar10 < 0x500) {
            uVar15 = iVar3 - 0x202U | 0x800;
          }
          else {
            uVar15 = iVar3 - 0x1602U | 0x70000;
            if (uVar10 < 0x1500) {
              uVar15 = iVar3 - 0x602U | 0x6000;
            }
          }
        }
        cVar8 = lzham::symbol_codec::encode_bits(uVar16,uVar15);
      }
      if (cVar8 == '\0') {
        return false;
      }
    }
    if (*(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)uVar18) < 3) {
      cVar8 = lzham::symbol_codec::encode_bits(uVar16,uVar17);
    }
    else {
      if ((4 < *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)uVar18)) &&
         (cVar8 = lzham::symbol_codec::encode_bits(uVar16,uVar17 >> 4), cVar8 == '\0')) {
        return false;
      }
      cVar8 = lzham::symbol_codec::encode
                        (uVar16,(quasi_adaptive_huffman_data_model *)(ulong)(uVar17 & 0xf));
    }
    if (cVar8 != '\0') {
      uVar9 = lzdec->m_dist;
      (this->super_state_base).m_match_hist[3] = (this->super_state_base).m_match_hist[2];
      *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
           *(undefined8 *)(this->super_state_base).m_match_hist;
      (this->super_state_base).m_match_hist[0] = uVar9;
      uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 7;
LAB_0010c8e2:
      (this->super_state_base).m_cur_state = uVar9;
      (this->super_state_base).m_cur_ofs = lzdec->m_len + lzdec->m_pos + (uint)(lzdec->m_len == 0);
      return true;
    }
  }
  return false;
}

Assistant:

bool lzcompressor::state::encode(symbol_codec& codec, CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      //const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(m_cur_state);
      if (!codec.encode(lzdec.is_match(), m_is_match_model[is_match_model_index])) 
      {
         LZHAM_LOG_ERROR(8018);
         return false;
      }

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(lit, 8)) 
         {
            LZHAM_LOG_ERROR(8019);  
            return false;
         }
#endif

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            // literal
            if (!codec.encode(lit, m_lit_table)) 
            {
               LZHAM_LOG_ERROR(8020);
               return false;
            }
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            
            uint delta_lit = rep_lit0 ^ lit;

#ifdef LZHAM_LZDEBUG
            if (!codec.encode_bits(rep_lit0, 8)) 
            {
               LZHAM_LOG_ERROR(8021);
               return false;
            }
#endif

            if (!codec.encode(delta_lit, m_delta_lit_table)) 
            {
               LZHAM_LOG_ERROR(8022);
               return false;
            }
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            if (!codec.encode(1, m_is_rep_model[m_cur_state])) 
            {
               LZHAM_LOG_ERROR(8023);
               return false;
            }

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               if (!codec.encode(1, m_is_rep0_model[m_cur_state])) 
               {
                  LZHAM_LOG_ERROR(8024);
                  return false;
               }

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  if (!codec.encode(1, m_is_rep0_single_byte_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8025);
                     return false;
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  if (!codec.encode(0, m_is_rep0_single_byte_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8026);
                     return false;
                  }

                  if (lzdec.m_len > CLZBase::cMaxMatchLen)
                  {
                     if (!codec.encode((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                     {
                        LZHAM_LOG_ERROR(8027);
                        return false;
                     }
                     if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                     {
                        LZHAM_LOG_ERROR(8028);
                        return false;
                     }
                  }
                  else
                  {
                     if (!codec.encode(lzdec.m_len - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                     {
                        LZHAM_LOG_ERROR(8029);
                        return false;
                     }
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               if (!codec.encode(0, m_is_rep0_model[m_cur_state])) 
               {
                  LZHAM_LOG_ERROR(8030);
                  return false;
               }

               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!codec.encode((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8031);
                     return false;
                  }
                  if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                  {
                     LZHAM_LOG_ERROR(8032);
                     return false;
                  }
               }
               else
               {
                  if (!codec.encode(lzdec.m_len - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8033);
                     return false;
                  }
               }

               if (match_hist_index == 1)
               {
                  // rep1
                  if (!codec.encode(1, m_is_rep1_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8034);
                     return false;
                  }

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  if (!codec.encode(0, m_is_rep1_model[m_cur_state])) 
                  {  
                     LZHAM_LOG_ERROR(8035);
                     return false;
                  }

                  if (match_hist_index == 2)
                  {
                     // rep2
                     if (!codec.encode(1, m_is_rep2_model[m_cur_state])) 
                     {
                        LZHAM_LOG_ERROR(8036);
                        return false;
                     }

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     if (!codec.encode(0, m_is_rep2_model[m_cur_state])) 
                     {
                        LZHAM_LOG_ERROR(8037);  
                        return false;
                     }

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            if (!codec.encode(0, m_is_rep_model[m_cur_state])) 
            {
               LZHAM_LOG_ERROR(8038);
               return false;
            }

            LZHAM_ASSERT(lzdec.m_len >= CLZBase::cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!codec.encode(CLZBase::cLZXNumSpecialLengths + main_sym, m_main_table)) 
            {  
               LZHAM_LOG_ERROR(8039);
               return false;
            }

            if (large_len_sym >= 0)
            {
               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!codec.encode((CLZBase::cMaxMatchLen + 1) - 9, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8040);
                     return false;
                  }
                  if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                  {
                     LZHAM_LOG_ERROR(8041);
                     return false;
                  }
               }
               else
               {
                  if (!codec.encode(large_len_sym, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8042);
                     return false;
                  }
               }
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
            {
               if (!codec.encode_bits(match_extra, num_extra_bits)) 
               {
                  LZHAM_LOG_ERROR(8043);
                  return false;
               }
            }
            else
            {
               if (num_extra_bits > 4)
               {
                  if (!codec.encode_bits((match_extra >> 4), num_extra_bits - 4)) 
                  {
                     LZHAM_LOG_ERROR(8044);
                     return false;
                  }
               }

               if (!codec.encode(match_extra & 15, m_dist_lsb_table)) 
               {
                  LZHAM_LOG_ERROR(8045);
                  return false;
               }
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(m_match_hist[0], 29)) 
         {
            LZHAM_LOG_ERROR(8046);
            return false;
         }
#endif
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }